

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathStartsWithFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  uint uVar1;
  int iVar2;
  xmlXPathObjectPtr pxVar3;
  ulong uVar4;
  xmlXPathObjectPtr value;
  uint uVar5;
  xmlXPathObjectPtr *ppxVar6;
  xmlXPathObjectPtr pxVar7;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs != 2) {
    iVar2 = 0xc;
    goto LAB_001bf71e;
  }
  uVar1 = ctxt->valueNr;
  if ((int)uVar1 < 2) {
    iVar2 = 0x17;
    goto LAB_001bf71e;
  }
  if (ctxt->value != (xmlXPathObjectPtr)0x0) {
    if (ctxt->value->type == XPATH_STRING) {
      uVar5 = uVar1 - 1;
      ctxt->valueNr = uVar5;
      ppxVar6 = ctxt->valueTab;
LAB_001bf5e7:
      uVar4 = (ulong)uVar5;
      pxVar7 = ppxVar6[(ulong)uVar1 - 2];
LAB_001bf5f0:
      ctxt->value = pxVar7;
      uVar1 = (uint)uVar4;
      pxVar7 = ppxVar6[uVar4];
      ppxVar6[uVar4] = (xmlXPathObjectPtr)0x0;
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
        xmlXPathStringFunction(ctxt,1);
        uVar1 = ctxt->valueNr;
      }
      if (0 < (int)uVar1) {
        uVar5 = uVar1 - 1;
        ctxt->valueNr = uVar5;
        ppxVar6 = ctxt->valueTab;
        if (uVar1 == 1) {
          pxVar3 = (xmlXPathObjectPtr)0x0;
        }
        else {
          pxVar3 = ppxVar6[(ulong)uVar1 - 2];
        }
        ctxt->value = pxVar3;
        pxVar3 = ppxVar6[uVar5];
        ppxVar6[uVar5] = (xmlXPathObjectPtr)0x0;
        if (pxVar3 != (xmlXPathObjectPtr)0x0) {
          if (pxVar3->type == XPATH_STRING) {
            iVar2 = xmlStrlen(pxVar7->stringval);
            iVar2 = xmlStrncmp(pxVar3->stringval,pxVar7->stringval,iVar2);
            value = xmlXPathCacheNewBoolean(ctxt,(uint)(iVar2 == 0));
            xmlXPathValuePush(ctxt,value);
            xmlXPathReleaseObject(ctxt->context,pxVar3);
            xmlXPathReleaseObject(ctxt->context,pxVar7);
            return;
          }
          xmlXPathReleaseObject(ctxt->context,pxVar3);
        }
      }
    }
    else {
      xmlXPathStringFunction(ctxt,1);
      if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_STRING))
      goto LAB_001bf716;
      uVar1 = ctxt->valueNr;
      uVar4 = 0;
      if (0 < (int)uVar1) {
        uVar5 = uVar1 - 1;
        ctxt->valueNr = uVar5;
        ppxVar6 = ctxt->valueTab;
        if (uVar1 != 1) goto LAB_001bf5e7;
        pxVar7 = (xmlXPathObjectPtr)0x0;
        goto LAB_001bf5f0;
      }
      pxVar7 = (xmlXPathObjectPtr)0x0;
    }
    xmlXPathReleaseObject(ctxt->context,pxVar7);
  }
LAB_001bf716:
  iVar2 = 0xb;
LAB_001bf71e:
  xmlXPathErr(ctxt,iVar2);
  return;
}

Assistant:

void
xmlXPathStartsWithFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr hay, needle;
    int n;

    CHECK_ARITY(2);
    CAST_TO_STRING;
    CHECK_TYPE(XPATH_STRING);
    needle = xmlXPathValuePop(ctxt);
    CAST_TO_STRING;
    hay = xmlXPathValuePop(ctxt);

    if ((hay == NULL) || (hay->type != XPATH_STRING)) {
	xmlXPathReleaseObject(ctxt->context, hay);
	xmlXPathReleaseObject(ctxt->context, needle);
	XP_ERROR(XPATH_INVALID_TYPE);
    }
    n = xmlStrlen(needle->stringval);
    if (xmlStrncmp(hay->stringval, needle->stringval, n))
        xmlXPathValuePush(ctxt, xmlXPathCacheNewBoolean(ctxt, 0));
    else
        xmlXPathValuePush(ctxt, xmlXPathCacheNewBoolean(ctxt, 1));
    xmlXPathReleaseObject(ctxt->context, hay);
    xmlXPathReleaseObject(ctxt->context, needle);
}